

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O1

void __thiscall
itlib::small_vector<double,_4UL,_0UL,_std::allocator<double>_>::assign_impl
          (small_vector<double,_4UL,_0UL,_std::allocator<double>_> *this,size_type count,
          double *value)

{
  double *pdVar1;
  double *pdVar2;
  size_t sVar3;
  
  pdVar1 = choose_data(this,count);
  this->m_end = pdVar1;
  this->m_begin = pdVar1;
  pdVar2 = pdVar1;
  if (count != 0) {
    do {
      *pdVar2 = *value;
      pdVar2 = pdVar2 + 1;
      count = count - 1;
    } while (count != 0);
    this->m_end = pdVar2;
  }
  sVar3 = 4;
  if ((type *)pdVar1 != this->m_static_data) {
    sVar3 = this->m_dynamic_capacity;
  }
  this->m_capacity = sVar3;
  return;
}

Assistant:

void assign_impl(size_type count, const T& value)
    {
        assert(m_begin);
        assert(m_begin == m_end);

        m_begin = m_end = choose_data(count);
        for (size_type i = 0; i < count; ++i)
        {
            atraits::construct(get_alloc(), m_end, value);
            ++m_end;
        }

        update_capacity();
    }